

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

Am_Object am_get_db_from_list(Am_Object *proto,Am_Value_List *db_list,int *cnt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Am_Value *pAVar5;
  Am_Object *this;
  int *in_RCX;
  Am_Object local_40;
  Am_Value_List local_38;
  
  proto->data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value_List::Empty((Am_Value_List *)cnt);
  if (bVar1) {
    Am_Object::Create((Am_Object *)&local_38,(char *)db_list);
    Am_Object::operator=(proto,(Am_Object *)&local_38);
    Am_Object::~Am_Object((Am_Object *)&local_38);
    Am_Object::Am_Object(&local_40,proto);
    Am_Object::Add_Part(&Am_Screen,&local_40,true,0);
    Am_Object::~Am_Object(&local_40);
  }
  else {
    Am_Value_List::Pop(&local_38,SUB81(cnt,0));
    Am_Object::operator=(proto,(Am_Value *)&local_38);
    Am_Value::~Am_Value((Am_Value *)&local_38);
  }
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"window  ",8);
    poVar4 = operator<<((ostream *)&std::cout,proto);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  pAVar5 = Am_Object::Get(&Am_Screen,0x66,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(proto,0x66,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  this = Am_Object::Set(proto,100,*in_RCX * 0x19 + (iVar2 - iVar3) / 2,0);
  pAVar5 = Am_Object::Get(&Am_Screen,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(proto,0x67,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(this,0x65,*in_RCX * 0x19 + (iVar2 - iVar3) / 2,0);
  *in_RCX = *in_RCX + 1;
  return (Am_Object)(Am_Object_Data *)proto;
}

Assistant:

Am_Object
am_get_db_from_list(Am_Object &proto, Am_Value_List &db_list, int &cnt)
{
  Am_Object w;
  if (!db_list.Empty()) {
    w = db_list.Pop();
  } else {
    w = proto.Create();
    Am_Screen.Add_Part(w);
  }
  if (am_sdebug)
    std::cout << "window  " << w << std::endl << std::flush;

  w.Set(Am_LEFT,
        ((int)Am_Screen.Get(Am_WIDTH) - (int)w.Get(Am_WIDTH)) / 2 + cnt * 25)
      .Set(Am_TOP, ((int)Am_Screen.Get(Am_HEIGHT) - (int)w.Get(Am_HEIGHT)) / 2 +
                       cnt * 25);
  cnt++;
  return w;
}